

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * get_BYTECODE_varname(Context *ctx,RegisterType rt,int regnum)

{
  char *pcVar1;
  char local_78 [8];
  char buf [64];
  char *regtype_str;
  char regnum_str [16];
  int regnum_local;
  RegisterType rt_local;
  Context *ctx_local;
  
  regnum_str._8_4_ = regnum;
  regnum_str._12_4_ = rt;
  pcVar1 = get_D3D_register_string(ctx,rt,regnum,(char *)&regtype_str,0x10);
  snprintf(local_78,0x40,"%s%s",pcVar1,&regtype_str);
  pcVar1 = StrDup(ctx,local_78);
  return pcVar1;
}

Assistant:

static const char *get_BYTECODE_varname(Context *ctx, RegisterType rt, int regnum)
{
    char regnum_str[16];
    const char *regtype_str = get_D3D_register_string(ctx, rt, regnum,
                                              regnum_str, sizeof (regnum_str));
    char buf[64];
    snprintf(buf, sizeof (buf), "%s%s", regtype_str, regnum_str);
    return StrDup(ctx, buf);
}